

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

void freedirs(ftp_conn *ftpc)

{
  long lVar1;
  
  if (ftpc->dirs != (char **)0x0) {
    lVar1 = 0;
    while( true ) {
      if (ftpc->dirdepth <= lVar1) break;
      (*Curl_cfree)(ftpc->dirs[lVar1]);
      ftpc->dirs[lVar1] = (char *)0x0;
      lVar1 = lVar1 + 1;
    }
    (*Curl_cfree)(ftpc->dirs);
    ftpc->dirs = (char **)0x0;
    ftpc->dirdepth = 0;
  }
  (*Curl_cfree)(ftpc->file);
  ftpc->file = (char *)0x0;
  (*Curl_cfree)(ftpc->newhost);
  ftpc->newhost = (char *)0x0;
  return;
}

Assistant:

static void freedirs(struct ftp_conn *ftpc)
{
  int i;
  if(ftpc->dirs) {
    for(i=0; i < ftpc->dirdepth; i++) {
      free(ftpc->dirs[i]);
      ftpc->dirs[i]=NULL;
    }
    free(ftpc->dirs);
    ftpc->dirs = NULL;
    ftpc->dirdepth = 0;
  }
  Curl_safefree(ftpc->file);

  /* no longer of any use */
  Curl_safefree(ftpc->newhost);
}